

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV3PosAnimationBlock(Parser *this,Animation *anim)

{
  byte bVar1;
  iterator __position;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *__s2;
  int iVar5;
  pointer paVar6;
  uint iIndex;
  uint local_54;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *local_50;
  aiVectorKey local_48;
  
  local_50 = &anim->akeyPositions;
  __s2 = (byte *)this->filePtr;
  iVar5 = 0;
  do {
    bVar1 = *__s2;
    if (bVar1 == 0x2a) {
      pbVar4 = __s2 + 1;
      this->filePtr = (char *)pbVar4;
      iVar3 = strncmp("CONTROL_POS_SAMPLE",(char *)pbVar4,0x12);
      if (iVar3 == 0) {
        bVar1 = __s2[0x13];
        bVar2 = false;
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar4 = __s2 + 0x14;
          if (bVar1 == 0) {
            pbVar4 = __s2 + 0x13;
          }
          this->filePtr = (char *)pbVar4;
          anim->mPositionType = TRACK;
          bVar2 = true;
          pbVar4 = (byte *)this->filePtr;
        }
      }
      else {
        bVar2 = false;
      }
      __s2 = pbVar4;
      iVar3 = strncmp("CONTROL_BEZIER_POS_KEY",(char *)__s2,0x16);
      if (iVar3 == 0) {
        bVar1 = __s2[0x16];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar4 = __s2 + 0x17;
          if (bVar1 == 0) {
            pbVar4 = __s2 + 0x16;
          }
          this->filePtr = (char *)pbVar4;
          anim->mPositionType = BEZIER;
          __s2 = (byte *)this->filePtr;
          bVar2 = true;
        }
      }
      iVar3 = strncmp("CONTROL_TCB_POS_KEY",(char *)__s2,0x13);
      if (iVar3 == 0) {
        bVar1 = __s2[0x13];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003def82;
        pbVar4 = __s2 + 0x14;
        if (bVar1 == 0) {
          pbVar4 = __s2 + 0x13;
        }
        this->filePtr = (char *)pbVar4;
        anim->mPositionType = TCB;
LAB_003defc8:
        local_48.mTime = 0.0;
        local_48.mValue.x = 0.0;
        local_48.mValue.y = 0.0;
        local_48.mValue.z = 0.0;
        __position._M_current =
             (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::_M_realloc_insert<aiVectorKey>
                    (local_50,__position,&local_48);
          paVar6 = (anim->akeyPositions).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->mTime = 0.0;
          ((__position._M_current)->mValue).x = 0.0;
          ((__position._M_current)->mValue).y = 0.0;
          ((__position._M_current)->mValue).z = 0.0;
          paVar6 = (anim->akeyPositions).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
          (anim->akeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
          _M_impl.super__Vector_impl_data._M_finish = paVar6;
        }
        ParseLV4MeshFloatTriple(this,&paVar6[-1].mValue.x,&local_54);
        paVar6[-1].mTime = (double)local_54;
        __s2 = (byte *)this->filePtr;
      }
      else {
LAB_003def82:
        if (bVar2) goto LAB_003defc8;
      }
      bVar1 = *__s2;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003df076;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        if (bVar1 == 0) {
          LogError(this,
                   "Encountered unexpected EOL while parsing a *CONTROL_POS_TRACK chunk (Level 3)");
        }
      }
    }
    else {
      if (bVar1 == 0x7d) {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          this->filePtr = (char *)(__s2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_003df078;
        iVar5 = iVar5 + 1;
      }
LAB_003df076:
      bVar2 = false;
    }
LAB_003df078:
    this->bLastWasEndLine = bVar2;
    __s2 = __s2 + 1;
    this->filePtr = (char *)__s2;
  } while( true );
}

Assistant:

void Parser::ParseLV3PosAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the three floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_POS_SAMPLE" ,18))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_POS_KEY" ,22))
            {
                b = true;
                anim.mPositionType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_POS_KEY" ,19))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyPositions.push_back(aiVectorKey());
                aiVectorKey& key = anim.akeyPositions.back();
                ParseLV4MeshFloatTriple(&key.mValue.x,iIndex);
                key.mTime = (double)iIndex;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_POS_TRACK");
    }
}